

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O0

void __thiscall DPhased::Tick(DPhased *this)

{
  int steps;
  DPhased *this_local;
  
  if (this->m_Phase < 0xc) {
    sector_t::SetLightLevel
              ((sector_t *)(this->super_DLighting).super_DSectorEffect.m_Sector,
               (int)((0xff - (uint)this->m_BaseLevel) * (uint)this->m_Phase) / 0xc +
               (uint)this->m_BaseLevel);
  }
  else if (this->m_Phase < 0x18) {
    sector_t::SetLightLevel
              ((sector_t *)(this->super_DLighting).super_DSectorEffect.m_Sector,
               (int)((0xff - (uint)this->m_BaseLevel) * (0x17 - (uint)this->m_Phase)) / 0xc +
               (uint)this->m_BaseLevel);
  }
  else {
    sector_t::SetLightLevel
              ((sector_t *)(this->super_DLighting).super_DSectorEffect.m_Sector,
               (uint)this->m_BaseLevel);
  }
  if (this->m_Phase == '\0') {
    this->m_Phase = '?';
  }
  else {
    this->m_Phase = this->m_Phase + 0xff;
  }
  return;
}

Assistant:

void DPhased::Tick ()
{
	const int steps = 12;

	if (m_Phase < steps)
		m_Sector->SetLightLevel( ((255 - m_BaseLevel) * m_Phase) / steps + m_BaseLevel);
	else if (m_Phase < 2*steps)
		m_Sector->SetLightLevel( ((255 - m_BaseLevel) * (2*steps - m_Phase - 1) / steps
								+ m_BaseLevel));
	else
		m_Sector->SetLightLevel(m_BaseLevel);

	if (m_Phase == 0)
		m_Phase = 63;
	else
		m_Phase--;
}